

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::ConeRecord2::ConeRecord2
          (ConeRecord2 *this,KUINT8 Index,WorldCoordinates *VertexLocation,EulerAngles *Orientation,
          Vector *Velocity,Vector *AngularVelocity,KFLOAT32 Height,KFLOAT32 PeakAngle,
          KFLOAT32 DHeightOverDt,KFLOAT32 DPeakAngleOverDt)

{
  KFLOAT32 KVar1;
  
  ConeRecord1::ConeRecord1
            (&this->super_ConeRecord1,Index,VertexLocation,Orientation,Height,PeakAngle);
  (this->super_ConeRecord1).super_EnvironmentRecord.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ConeRecord2_00232920;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar1 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar1;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  (this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar1 = AngularVelocity->m_f32Y;
  (this->m_AngularVelocity).m_f32X = AngularVelocity->m_f32X;
  (this->m_AngularVelocity).m_f32Y = KVar1;
  (this->m_AngularVelocity).m_f32Z = AngularVelocity->m_f32Z;
  this->m_f32ddtHeight = DHeightOverDt;
  this->m_f32ddtPeak = DPeakAngleOverDt;
  (this->super_ConeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp = 0x30000000;
  (this->super_ConeRecord1).super_EnvironmentRecord.m_ui16Length = 0x2c0;
  return;
}

Assistant:

ConeRecord2::ConeRecord2( KUINT8 Index, const WorldCoordinates & VertexLocation, const EulerAngles & Orientation,
                          const Vector & Velocity, const Vector & AngularVelocity, KFLOAT32 Height,
                          KFLOAT32 PeakAngle, KFLOAT32 DHeightOverDt, KFLOAT32 DPeakAngleOverDt ) :
    ConeRecord1( Index, VertexLocation, Orientation, Height, PeakAngle ),
    m_Velocity( Velocity ),
    m_AngularVelocity( AngularVelocity ),
    m_f32ddtHeight( DHeightOverDt ),
    m_f32ddtPeak( DPeakAngleOverDt )
{
    m_ui32EnvRecTyp = ConeRecord2Type;
    m_ui16Length = CONE_RECORD_2_SIZE * 8;
}